

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O2

void __thiscall
Component_takeEncapsulatedComponent_Test::TestBody(Component_takeEncapsulatedComponent_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  string local_f0 [32];
  shared_ptr<libcellml::Component> local_d0;
  allocator<char> local_b9;
  AssertionResult gtest_ar;
  ComponentPtr c1;
  void *local_98;
  ComponentPtr c4;
  ComponentPtr c2;
  ModelPtr m;
  ComponentPtr c6;
  ComponentPtr c5;
  ComponentPtr c;
  ComponentPtr c3;
  
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"",(allocator<char> *)&c1);
  pcVar3 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&c,"",(allocator<char> *)&c2);
  createModelWithComponent((string *)&m,local_f0);
  std::__cxx11::string::~string((string *)&c);
  std::__cxx11::string::~string(local_f0);
  libcellml::ComponentEntity::component((ulong)&c);
  peVar2 = c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"child0",(allocator<char> *)&c1);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"child1",(allocator<char> *)&c2);
  libcellml::Component::create((string *)&c1);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"child2",(allocator<char> *)&c3);
  libcellml::Component::create((string *)&c2);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"child3",(allocator<char> *)&c4);
  libcellml::Component::create((string *)&c3);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"child4",(allocator<char> *)&c5);
  libcellml::Component::create((string *)&c4);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"child5",(allocator<char> *)&c6);
  libcellml::Component::create((string *)&c5);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"child6",(allocator<char> *)&gtest_ar)
  ;
  libcellml::Component::create((string *)&c6);
  std::__cxx11::string::~string(local_f0);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)
             c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)
             c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)
             c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)
             c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)
             c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  bVar1 = (bool)m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  local_98 = (void *)0x0;
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"child4",&local_b9);
  libcellml::ComponentEntity::takeComponent((string *)&local_d0,bVar1);
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::Component>>
            ((internal *)&gtest_ar,"nullptr","m->takeComponent(\"child4\", false)",&local_98,
             &local_d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string(local_f0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_f0);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/component.cpp"
               ,0x1d1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"child4",(allocator<char> *)&local_98)
  ;
  libcellml::ComponentEntity::takeComponent
            ((string *)&local_d0,
             (bool)m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_);
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Component>,std::shared_ptr<libcellml::Component>>
            ((internal *)&gtest_ar,"c4","m->takeComponent(\"child4\", true)",&c4,&local_d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string(local_f0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_f0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/component.cpp"
               ,0x1d2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c6.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c5.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c4.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c3.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Component, takeEncapsulatedComponent)
{
    libcellml::ModelPtr m = createModelWithComponent();
    libcellml::ComponentPtr c = m->component(0);
    c->setName("child0");
    libcellml::ComponentPtr c1 = libcellml::Component::create("child1");
    libcellml::ComponentPtr c2 = libcellml::Component::create("child2");
    libcellml::ComponentPtr c3 = libcellml::Component::create("child3");
    libcellml::ComponentPtr c4 = libcellml::Component::create("child4");
    libcellml::ComponentPtr c5 = libcellml::Component::create("child5");
    libcellml::ComponentPtr c6 = libcellml::Component::create("child6");

    c->addComponent(c1);
    c->addComponent(c2);
    c1->addComponent(c4);
    c1->addComponent(c5);
    c1->addComponent(c6);

    EXPECT_EQ(nullptr, m->takeComponent("child4", false));
    EXPECT_EQ(c4, m->takeComponent("child4", true));
}